

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

void __thiscall Color::Color(Color *this,string *str)

{
  ostream *poVar1;
  LandstalkerException *this_00;
  uint16_t b;
  uint16_t g;
  uint16_t r;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  uint auStack_1a8 [88];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this->_r = '\0';
  this->_g = '\0';
  this->_b = '\0';
  this->_invalid = true;
  if (str->_M_string_length == 7) {
    if (*(str->_M_dataplus)._M_p != '#') goto LAB_001990a4;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    poVar1 = std::operator<<((ostream *)local_1c0._M_local_buf,(str->_M_dataplus)._M_p[1]);
    std::operator<<(poVar1,(str->_M_dataplus)._M_p[2]);
    std::istream::_M_extract<unsigned_short>((ushort *)&ss);
    std::ios::clear((int)&ss + (int)*(undefined8 *)(_ss + -0x18));
    *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    poVar1 = std::operator<<((ostream *)local_1c0._M_local_buf,(str->_M_dataplus)._M_p[3]);
    std::operator<<(poVar1,(str->_M_dataplus)._M_p[4]);
    std::istream::_M_extract<unsigned_short>((ushort *)&ss);
    std::ios::clear((int)&ss + (int)*(undefined8 *)(_ss + -0x18));
    *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    poVar1 = std::operator<<((ostream *)local_1c0._M_local_buf,(str->_M_dataplus)._M_p[5]);
    std::operator<<(poVar1,(str->_M_dataplus)._M_p[6]);
    std::istream::_M_extract<unsigned_short>((ushort *)&ss);
  }
  else {
    if ((str->_M_string_length != 4) || (*(str->_M_dataplus)._M_p != '#')) {
LAB_001990a4:
      this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_48,"Could not parse Color from string \'",str);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &local_48,"\'. Valid formats are \"#RGB\" and \"#RRGGBB\"");
      LandstalkerException::LandstalkerException(this_00,(string *)&ss);
      __cxa_throw(this_00,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    std::operator<<((ostream *)local_1c0._M_local_buf,(str->_M_dataplus)._M_p[1]);
    std::istream::_M_extract<unsigned_short>((ushort *)&ss);
    std::ios::clear((int)&ss + (int)*(undefined8 *)(_ss + -0x18));
    *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    std::operator<<((ostream *)local_1c0._M_local_buf,(str->_M_dataplus)._M_p[2]);
    std::istream::_M_extract<unsigned_short>((ushort *)&ss);
    std::ios::clear((int)&ss + (int)*(undefined8 *)(_ss + -0x18));
    *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_1a8 + *(long *)(local_1c0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    std::operator<<((ostream *)local_1c0._M_local_buf,(str->_M_dataplus)._M_p[3]);
    std::istream::_M_extract<unsigned_short>((ushort *)&ss);
    r._0_1_ = (uint8_t)r << 4;
    g._0_1_ = (uint8_t)g << 4;
    b._0_1_ = (uint8_t)b << 4;
  }
  this->_r = (uint8_t)r;
  this->_g = (uint8_t)g;
  this->_b = (uint8_t)b;
  this->_invalid = false;
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

Color::Color(const std::string& str)
{
    uint16_t r, g, b;
    if(str.size() == 4 && str.starts_with('#'))
    {
        // Format 1 : "#RGB"
        std::stringstream ss;
        ss << std::hex << str[1];
        ss >> r;
        ss.clear();
        ss << std::hex << str[2];
        ss >> g;
        ss.clear();
        ss << std::hex << str[3];
        ss >> b;

        this->rgb((uint8_t)r << 4, (uint8_t)g << 4, (uint8_t)b << 4);
    }
    else if(str.size() == 7 && str.starts_with('#'))
    {
        // Format 2 : "#RRGGBB"
        std::stringstream ss;
        ss << std::hex << str[1] << str[2];
        ss >> r;
        ss.clear();
        ss << std::hex << str[3] << str[4];
        ss >> g;
        ss.clear();
        ss << std::hex << str[5] << str[6];
        ss >> b;

        this->rgb((uint8_t)r, (uint8_t)g, (uint8_t)b);
    }
    else
    {
        throw LandstalkerException("Could not parse Color from string '" + str + "'. "
                                   "Valid formats are \"#RGB\" and \"#RRGGBB\"");
    }
}